

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationDataBuilder::copyContractionsFromBaseCE32
          (CollationDataBuilder *this,UnicodeString *context,UChar32 c,uint32_t ce32,
          ConditionalCE32 *cond,UErrorCode *errorCode)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  uint32_t uVar4;
  int32_t index;
  undefined4 srcLength;
  uint uVar5;
  uint uVar6;
  undefined2 *puVar7;
  Iterator suffixes;
  ConstChar16Ptr local_c8;
  UVector *local_c0;
  char16_t *local_b8;
  Iterator local_a8;
  
  index = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    index = -1;
    puVar7 = (undefined2 *)((ulong)(ce32 >> 0xc & 0xfffffffe) + (long)this->base->contexts);
    if ((ce32 >> 8 & 1) == 0) {
      uVar4 = copyFromBaseCE32(this,c,CONCAT22(*puVar7,puVar7[1]),'\x01',errorCode);
      index = addConditionalCE32(this,context,uVar4,errorCode);
      cond->next = index;
      if (U_ZERO_ERROR < *errorCode) {
        return 0;
      }
      cond = (ConditionalCE32 *)UVector::elementAt(&this->conditionalCE32s,index);
    }
    sVar1 = (context->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar6 = (context->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)sVar1 >> 5;
    }
    local_c8.p_ = puVar7 + 2;
    UCharsTrie::Iterator::Iterator(&local_a8,&local_c8,0,errorCode);
    local_b8 = local_c8.p_;
    local_c0 = &this->conditionalCE32s;
    while (UVar3 = UCharsTrie::Iterator::next(&local_a8,errorCode), UVar3 != '\0') {
      srcLength = local_a8.str_.fUnion.fFields.fLength;
      if (-1 < local_a8.str_.fUnion.fStackFields.fLengthAndFlags) {
        srcLength = (int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(context,&local_a8.str_,0,srcLength);
      uVar4 = copyFromBaseCE32(this,c,local_a8.value_,'\x01',errorCode);
      index = addConditionalCE32(this,context,uVar4,errorCode);
      cond->next = index;
      if (U_ZERO_ERROR < *errorCode) {
        index = 0;
        break;
      }
      cond = (ConditionalCE32 *)UVector::elementAt(local_c0,index);
      uVar2 = (context->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar2 & 1) == 0 || uVar6 != 0) {
        if ((short)uVar2 < 0) {
          uVar5 = (context->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)(short)uVar2 >> 5;
        }
        if (uVar6 < uVar5) {
          if ((int)uVar6 < 0x400) {
            (context->fUnion).fStackFields.fLengthAndFlags = uVar2 & 0x1f | (ushort)(uVar6 << 5);
          }
          else {
            (context->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
            (context->fUnion).fFields.fLength = uVar6;
          }
        }
      }
      else {
        UnicodeString::unBogus(context);
      }
    }
    UCharsTrie::Iterator::~Iterator(&local_a8);
  }
  return index;
}

Assistant:

int32_t
CollationDataBuilder::copyContractionsFromBaseCE32(UnicodeString &context, UChar32 c, uint32_t ce32,
                                                   ConditionalCE32 *cond, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
    int32_t index;
    if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
        // No match on the single code point.
        // We are underneath a prefix, and the default mapping is just
        // a fallback to the mappings for a shorter prefix.
        U_ASSERT(context.length() > 1);
        index = -1;
    } else {
        ce32 = CollationData::readCE32(p);  // Default if no suffix match.
        U_ASSERT(!Collation::isContractionCE32(ce32));
        ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        cond = getConditionalCE32(index);
    }

    int32_t suffixStart = context.length();
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        context.append(suffixes.getString());
        ce32 = copyFromBaseCE32(c, (uint32_t)suffixes.getValue(), TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        // No need to update the unsafeBackwardSet because the tailoring set
        // is already a copy of the base set.
        cond = getConditionalCE32(index);
        context.truncate(suffixStart);
    }
    U_ASSERT(index >= 0);
    return index;
}